

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O2

void lprint(lmat *m,char *caption,char *st,int ch,FILE *d)

{
  re_guts *prVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((m->eflags & 0x100) == 0) {
    return;
  }
  prVar1 = m->g;
  fputs(caption,(FILE *)d);
  if (ch != 0) {
    pchar(ch);
    fprintf((FILE *)d," %s",pchar::pbuf);
  }
  bVar2 = true;
  for (uVar4 = 0; (long)uVar4 < prVar1->nstates; uVar4 = uVar4 + 1) {
    if (st[uVar4] != '\0') {
      pcVar3 = "\t";
      if (!bVar2) {
        pcVar3 = ", ";
      }
      bVar2 = false;
      fprintf((FILE *)d,"%s%d",pcVar3,uVar4 & 0xffffffff);
    }
  }
  fputc(10,(FILE *)d);
  return;
}

Assistant:

static void
print(m, caption, st, ch, d)
struct match *m;
char *caption;
states st;
int ch;
FILE *d;
{
	struct re_guts *g = m->g;
	int i;
	int first = 1;

	if (!(m->eflags&REG_TRACE))
		return;

	fprintf(d, "%s", caption);
	if (ch != '\0')
		fprintf(d, " %s", pchar(ch));
	for (i = 0; i < g->nstates; i++)
		if (ISSET(st, i)) {
			fprintf(d, "%s%d", (first) ? "\t" : ", ", i);
			first = 0;
		}
	fprintf(d, "\n");
}